

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_table_base.hpp
# Opt level: O1

void __thiscall squall::TableBase::call<void>(TableBase *this,string *name)

{
  HSQUIRRELVM v;
  SQInteger newtop;
  
  v = this->vm_;
  newtop = sq_gettop(v);
  detail::call_setup<>(v,&this->tableobj_,name);
  sq_settop(v,newtop);
  return;
}

Assistant:

R call(const string& name, T... args) {
        return detail::call<R>(vm_, tableobj_, name, args...);
    }